

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O2

size_t __thiscall
tchecker::
pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
::collect(pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
          *this)

{
  size_t sVar1;
  char **ppcVar2;
  void *pbegin;
  char **ppcVar3;
  char **ppcVar4;
  size_t sVar5;
  void *pend;
  char **ppcVar6;
  
  ppcVar2 = &this->_block_head;
  ppcVar6 = (char **)0x0;
  ppcVar3 = (char **)0x0;
  sVar5 = 0;
  while (ppcVar2 = (char **)*ppcVar2, ppcVar2 != (char **)0x0) {
    sVar1 = this->_block_size;
    for (ppcVar4 = ppcVar2 + 1;
        (ppcVar4 != (char **)(sVar1 + (long)ppcVar2) &&
        ((ppcVar4 < this->_raw_head || (this->_raw_end <= ppcVar4))));
        ppcVar4 = (char **)((long)ppcVar4 + this->_alloc_size)) {
      if (*ppcVar4 == (char *)0x0) {
        *ppcVar4 = (char *)0xffffffffffffffff;
        graph::reachability::
        edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
        ::~edge_t((edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                   *)(ppcVar4 + 1));
        ppcVar4[1] = (char *)ppcVar3;
        if (ppcVar6 == (char **)0x0) {
          ppcVar6 = ppcVar4;
        }
        sVar5 = sVar5 + 1;
        ppcVar3 = ppcVar4;
      }
    }
  }
  if (sVar5 != 0) {
    ppcVar6[1] = this->_free_head;
    this->_free_head = (char *)ppcVar3;
  }
  return sVar5;
}

Assistant:

std::size_t collect()
  {
    std::size_t collected = 0;
    void *collected_begin = nullptr, *collected_end = nullptr;

    // Move to the free list all chunks in blocks list that are not in the
    // free list and that are unused
    for (void * block = _block_head; block != nullptr; block = nextblock(block)) {
      void * block_end = static_cast<char *>(block) + _block_size;

      for (char * chunk = first_chunk_ptr(block); chunk != block_end; chunk += _alloc_size) {
        // Ignore chunks inside unused raw block (refcount not set yet)
        if ((_raw_head <= chunk) && (chunk < _raw_end))
          break; // ignore the entire raw block

        // Collect all unused chunks in the free list
        typename T::refcount_t * refcount = reinterpret_cast<typename T::refcount_t *>(chunk);
        if (*refcount == COLLECTABLE_CHUNK) {
          // make the chunk free using its refcount
          *refcount = FREE_CHUNK;
          // destruct the object in the chunk
          T * t = reinterpret_cast<T *>(refcount + 1);
          T::destruct(t); // t->~T()
          // add the chunk to the list of collected chunks
          this->nextchunk(chunk) = collected_begin;
          if (collected_end == nullptr)
            collected_end = chunk;
          collected_begin = chunk;
          ++collected;
        }
      }
    }

    // release the collected chunks
    if (collected > 0)
      this->release(collected_begin, collected_end);

    return collected;
  }